

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O1

void h2v2_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                    JSAMPARRAY output_data)

{
  uint uVar1;
  int iVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  JSAMPROW pJVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  
  uVar1 = compptr->width_in_blocks;
  iVar2 = cinfo->max_v_samp_factor;
  uVar7 = cinfo->image_width;
  if (0 < (int)(uVar1 * 0x10 - uVar7) && 0 < (long)iVar2) {
    lVar9 = 0;
    do {
      memset(input_data[lVar9] + uVar7,(uint)input_data[lVar9][(ulong)uVar7 - 1],
             (ulong)(uVar1 * 0x10 + ~uVar7) + 1);
      lVar9 = lVar9 + 1;
    } while (iVar2 != lVar9);
  }
  if (0 < compptr->v_samp_factor) {
    lVar9 = 0;
    lVar6 = 0;
    do {
      if ((uVar1 & 0x1fffffff) != 0) {
        pJVar3 = input_data[lVar6];
        pJVar4 = input_data[lVar6 + 1];
        pJVar5 = output_data[lVar9];
        uVar7 = 1;
        lVar8 = 0;
        do {
          pJVar5[lVar8] =
               (JSAMPLE)(pJVar3[lVar8 * 2] + uVar7 +
                         (uint)pJVar4[lVar8 * 2] + (uint)pJVar3[lVar8 * 2 + 1] +
                         (uint)pJVar4[lVar8 * 2 + 1] >> 2);
          uVar7 = uVar7 ^ 3;
          lVar8 = lVar8 + 1;
        } while (uVar1 << 3 != (int)lVar8);
      }
      lVar6 = lVar6 + 2;
      lVar9 = lVar9 + 1;
    } while (lVar9 < compptr->v_samp_factor);
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_downsample(j_compress_ptr cinfo, jpeg_component_info *compptr,
                JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int inrow, outrow;
  JDIMENSION outcol;
  JDIMENSION output_cols = compptr->width_in_blocks * DCTSIZE;
  register JSAMPROW inptr0, inptr1, outptr;
  register int bias;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data, cinfo->max_v_samp_factor, cinfo->image_width,
                    output_cols * 2);

  inrow = 0;
  for (outrow = 0; outrow < compptr->v_samp_factor; outrow++) {
    outptr = output_data[outrow];
    inptr0 = input_data[inrow];
    inptr1 = input_data[inrow + 1];
    bias = 1;                   /* bias = 1,2,1,2,... for successive samples */
    for (outcol = 0; outcol < output_cols; outcol++) {
      *outptr++ =
        (JSAMPLE)((inptr0[0] + inptr0[1] + inptr1[0] + inptr1[1] + bias) >> 2);
      bias ^= 3;                /* 1=>2, 2=>1 */
      inptr0 += 2;  inptr1 += 2;
    }
    inrow += 2;
  }
}